

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

Image * render(Image *__return_storage_ptr__,Accel *accel,RenderStats *render_stats,Options *options
              )

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uchar uVar13;
  uchar uVar14;
  undefined1 auVar15 [8];
  undefined8 uVar16;
  Vec3 *__first1;
  size_t __i;
  const_reference pvVar17;
  Vec<float,_3UL> *__first1_00;
  int *piVar18;
  type puVar19;
  unsigned_long uVar20;
  type puVar21;
  pointer __first;
  pointer puVar22;
  unsigned_long *puVar23;
  type __args_1;
  type __args_2;
  float *__first1_01;
  undefined1 auVar26 [16];
  float fVar24;
  double dVar25;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  tuple<unsigned_char_&,_unsigned_char_&,_unsigned_char_&> local_a58;
  tuple<unsigned_char,_unsigned_char,_unsigned_char> local_a3b;
  ulong local_a38;
  size_t i;
  int local_a28;
  Scalar debug_threshold;
  int local_a20;
  uchar local_a19;
  undefined8 uStack_a18;
  uint8_t pixel;
  float local_a10;
  undefined8 local_a08;
  float local_a00;
  float local_9fc;
  size_t sStack_9f8;
  Scalar intensity;
  size_t prim_id;
  float local_9e8;
  float local_9e0 [2];
  float local_9d8;
  Vec<float,_3UL> local_9d0;
  float local_9c0 [2];
  float local_9b8;
  float local_9b0 [2];
  float local_9a8;
  Vec<float,_3UL> local_9a0;
  Vec<float,_3UL> local_990;
  size_t local_984;
  float local_97c;
  undefined1 local_978 [8];
  Ray ray;
  TraversalStats traversal_stats;
  size_t pixel_id;
  Scalar v_2;
  Scalar u;
  size_t x;
  size_t y;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> local_910;
  __array debug_data;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> local_8f4;
  Vec<float,_3UL> up;
  Vec<float,_3UL> local_8c8;
  float fStack_8bc;
  undefined1 local_8b8 [8];
  Vec<float,_3UL> right;
  undefined1 local_898 [8];
  Vec<float,_3UL> dir;
  IntersectAccelFn intersect_accel;
  Options *options_local;
  RenderStats *render_stats_local;
  Accel *accel_local;
  Image *image;
  anon_class_16_2_94731e0a local_840;
  Vec<float,_3UL> *local_830;
  Vec<float,_3UL> *local_828;
  ulong local_820;
  float local_818;
  ulong local_810;
  float local_808;
  ulong local_800;
  float local_7f8;
  anon_class_16_2_94731e0a local_7f0;
  Vec<float,_3UL> *local_7e0;
  Vec<float,_3UL> *local_7d8;
  ulong local_7d0;
  float local_7c8;
  ulong local_7c0;
  float local_7b8;
  ulong local_7b0;
  float local_7a8;
  Vec<float,_3UL> *local_7a0;
  float local_794;
  ulong local_790;
  float local_788;
  ulong local_780;
  float local_778;
  ulong local_770;
  float local_768;
  Vec<float,_3UL> *local_760;
  float local_754;
  ulong local_750;
  float local_748;
  ulong local_740;
  float local_738;
  anon_class_16_2_94732099 local_730;
  anon_class_16_2_94731e0a *local_720;
  undefined1 local_714 [8];
  Vec<float,_3UL> v_4;
  anon_class_16_2_94732099 local_6f8;
  anon_class_16_2_94731e0a *local_6e8;
  undefined1 local_6dc [8];
  Vec<float,_3UL> v_6;
  anon_class_16_2_94731e0a local_670;
  float local_65c;
  Vec<float,_3UL> *local_658;
  ulong local_650;
  float local_648;
  ulong local_640;
  float local_638;
  ulong local_630;
  float local_628;
  anon_class_16_2_94731e0a local_620;
  float local_60c;
  Vec<float,_3UL> *local_608;
  ulong local_600;
  float local_5f8;
  ulong local_5f0;
  float local_5e8;
  anon_class_16_2_94732099 local_5e0;
  anon_class_16_2_94731e0a *local_5d0;
  undefined1 local_5c4 [8];
  Vec<float,_3UL> v_5;
  anon_class_16_2_94732099 local_5a8;
  anon_class_16_2_94731e0a *local_598;
  undefined1 local_58c [8];
  Vec<float,_3UL> v_3;
  uint local_52c;
  undefined1 *local_528;
  undefined1 *local_520;
  _Head_base<0UL,_unsigned_long_*,_false> local_514;
  undefined8 local_508;
  undefined1 *local_500;
  undefined8 local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  undefined8 local_4d8;
  undefined1 *local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined1 *local_4a0;
  undefined8 local_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined1 *local_450;
  float local_448 [5];
  undefined4 local_434;
  Vec3 *local_430;
  undefined1 *local_428;
  float local_41c;
  undefined4 uStack_418;
  undefined8 local_410;
  Vec3 *local_408;
  undefined8 local_400;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  Vec3 *local_3e8;
  undefined8 local_3e0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  Vec3 *local_3c8;
  undefined8 local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  Vec3 *local_3a8;
  undefined8 local_3a0;
  undefined1 *local_398;
  undefined8 local_390;
  Vec3 *local_388;
  undefined8 local_380;
  undefined1 *local_378;
  undefined8 local_370;
  Vec3 *local_368;
  undefined8 local_360;
  undefined1 *local_358;
  undefined4 *local_350;
  undefined4 local_348;
  float local_344;
  float *local_340;
  uint *local_338;
  undefined4 local_330;
  undefined4 local_32c;
  _Head_base<0UL,_unsigned_long_*,_false> *local_328;
  ulong local_320;
  float local_318;
  ulong local_310;
  float local_308;
  Vec<float,_3UL> *local_300;
  ulong local_2f8;
  float local_2f0;
  ulong local_2e8;
  float local_2e0;
  ulong local_2d8;
  float local_2d0;
  anon_class_16_2_94731e0a local_2c8;
  float local_2b4;
  Vec<float,_3UL> *local_2b0;
  ulong local_2a8;
  float local_2a0;
  ulong local_298;
  float local_290;
  anon_class_16_2_94732099 local_288;
  anon_class_16_2_94731e0a *local_278;
  undefined1 local_26c [8];
  Vec<float,_3UL> v_7;
  anon_class_16_2_94731e0a local_1e8;
  float local_1d4;
  Vec<float,_3UL> *local_1d0;
  float local_1c8 [2];
  float local_1c0;
  float local_1b8 [2];
  float local_1b0;
  anon_class_16_2_94732099 local_1a8;
  anon_class_16_2_94731e0a *local_198;
  undefined1 local_18c [8];
  Vec<float,_3UL> v_1;
  anon_class_16_2_94731e0a local_108;
  float local_f4;
  Vec3 *local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  anon_class_16_2_94732099 local_c8;
  anon_class_16_2_94731e0a *local_b8;
  undefined1 local_ac [8];
  Vec<float,_3UL> v;
  
  register0x00000000 = get_intersect_accel_fn(options);
  __first1 = &options->dir;
  auVar27._0_4_ =
       std::transform_reduce<float_const*,float_const*,float>
                 (__first1->values,(options->up).values,__first1->values,0.0);
  auVar27._4_60_ = extraout_var;
  dVar25 = std::sqrt(auVar27._0_8_);
  local_f4 = 1.0 / SUB84(dVar25,0);
  local_108.b = &local_f4;
  local_c8.f = &local_108;
  local_c8.v = (Vec<float,_3UL> *)local_ac;
  v.values._4_8_ = &local_c8;
  local_108.a = __first1;
  local_f0 = __first1;
  local_b8 = local_c8.f;
  bvh::v2::Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v.values._4_8_,0);
  uVar16 = v.values._4_8_;
  bvh::v2::Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v.values._4_8_,1);
  bvh::v2::Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar16,2);
  local_d0 = v.values[0];
  local_d8 = local_ac;
  local_e0 = v.values[0];
  local_e8 = local_ac;
  stack0xfffffffffffff758 = local_ac;
  dir.values[0] = v.values[0];
  local_898 = local_ac;
  auVar15 = local_898;
  local_430 = &options->up;
  local_360 = 1;
  local_898._4_4_ = local_ac._4_4_;
  local_370 = 2;
  local_380 = 2;
  local_390 = 1;
  auVar26 = vfmsub213ss_fma(ZEXT416((uint)(options->up).values[2]),ZEXT416((uint)local_898._4_4_),
                            ZEXT416((uint)(v.values[0] * (options->up).values[1])));
  local_3a0 = 2;
  local_3b0 = 0;
  local_3c0 = 0;
  local_898._0_4_ = local_ac._0_4_;
  local_3d0 = 2;
  auVar2 = vfmsub213ss_fma(ZEXT416((uint)local_430->values[0]),ZEXT416((uint)v.values[0]),
                           ZEXT416((uint)((float)local_898._0_4_ * (options->up).values[2])));
  local_3e0 = 0;
  local_3f0 = 1;
  local_400 = 1;
  local_410 = 0;
  auVar3 = vfmsub213ss_fma(ZEXT416((uint)(options->up).values[1]),ZEXT416((uint)local_898._0_4_),
                           ZEXT416((uint)((float)local_898._4_4_ * local_430->values[0])));
  local_434 = auVar3._0_4_;
  local_340 = &local_41c;
  local_344 = auVar26._0_4_;
  local_348 = auVar2._0_4_;
  local_350 = &local_434;
  local_41c = local_344;
  uStack_418 = (float)local_348;
  local_448[0] = local_41c;
  local_448[1] = uStack_418;
  local_8c8.values[0] = local_41c;
  local_8c8.values[1] = uStack_418;
  local_898 = auVar15;
  local_428 = local_898;
  local_408 = local_430;
  local_3f8 = local_898;
  local_3e8 = local_430;
  local_3d8 = local_898;
  local_3c8 = local_430;
  local_3b8 = local_898;
  local_3a8 = local_430;
  local_398 = local_898;
  local_388 = local_430;
  local_378 = local_898;
  local_368 = local_430;
  local_358 = local_898;
  auVar28._0_4_ =
       std::transform_reduce<float_const*,float_const*,float>
                 (local_8c8.values,&fStack_8bc,local_8c8.values,0.0);
  auVar28._4_60_ = extraout_var_00;
  dVar25 = std::sqrt(auVar28._0_8_);
  local_1d4 = 1.0 / SUB84(dVar25,0);
  local_1e8.b = &local_1d4;
  local_1a8.f = &local_1e8;
  local_1a8.v = (Vec<float,_3UL> *)local_18c;
  v_1.values._4_8_ = &local_1a8;
  local_1e8.a = &local_8c8;
  local_1d0 = &local_8c8;
  local_198 = local_1a8.f;
  bvh::v2::Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,0);
  uVar16 = v_1.values._4_8_;
  bvh::v2::Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,1);
  bvh::v2::Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar16,2);
  local_1b0 = v_1.values[0];
  local_1b8[0] = (float)local_18c._0_4_;
  local_1b8[1] = (float)local_18c._4_4_;
  local_1c0 = v_1.values[0];
  local_1c8[0] = (float)local_18c._0_4_;
  local_1c8[1] = (float)local_18c._4_4_;
  up.values[1] = (float)local_18c._0_4_;
  up.values[2] = (float)local_18c._4_4_;
  right.values[0] = v_1.values[0];
  local_8b8 = local_18c;
  auVar15 = local_8b8;
  local_520 = local_8b8;
  local_458 = 1;
  local_8b8._4_4_ = local_18c._4_4_;
  local_468 = 2;
  local_478 = 2;
  local_488 = 1;
  auVar26 = vfmsub213ss_fma(ZEXT416((uint)dir.values[0]),ZEXT416((uint)local_8b8._4_4_),
                            ZEXT416((uint)(v_1.values[0] * (float)local_898._4_4_)));
  local_498 = 2;
  local_4a8 = 0;
  local_4b8 = 0;
  local_8b8._0_4_ = local_18c._0_4_;
  local_4c8 = 2;
  auVar2 = vfmsub213ss_fma(ZEXT416((uint)local_898._0_4_),ZEXT416((uint)v_1.values[0]),
                           ZEXT416((uint)((float)local_8b8._0_4_ * dir.values[0])));
  local_4d8 = 0;
  local_4e8 = 1;
  local_4f8 = 1;
  local_508 = 0;
  auVar3 = vfmsub213ss_fma(ZEXT416((uint)local_898._4_4_),ZEXT416((uint)local_8b8._0_4_),
                           ZEXT416((uint)((float)local_8b8._4_4_ * (float)local_898._0_4_)));
  auVar29 = ZEXT1664(auVar3);
  local_328 = &local_514;
  local_32c = auVar26._0_4_;
  local_330 = auVar2._0_4_;
  local_338 = &local_52c;
  local_514._M_head_impl._0_4_ = local_32c;
  local_514._M_head_impl._4_4_ = local_330;
  auVar27 = ZEXT864(local_514._M_head_impl);
  auVar28 = ZEXT464(local_52c);
  debug_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       local_514._M_head_impl;
  local_8f4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)local_514._M_head_impl;
  local_8b8 = auVar15;
  local_52c = auVar3._0_4_;
  local_528 = local_898;
  local_500 = local_898;
  local_4f0 = local_520;
  local_4e0 = local_898;
  local_4d0 = local_520;
  local_4c0 = local_898;
  local_4b0 = local_520;
  local_4a0 = local_898;
  local_490 = local_520;
  local_480 = local_898;
  local_470 = local_520;
  local_460 = local_898;
  local_450 = local_520;
  if (options->render_mode == Debug) {
    std::make_unique<unsigned_long[]>((size_t)&local_910);
  }
  else {
    std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
    unique_ptr<std::default_delete<unsigned_long[]>,void>
              ((unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>> *)&local_910,
               (nullptr_t)0x0);
  }
  Image::Image(__return_storage_ptr__,options->width,options->height);
  for (x = 0; x < options->height; x = x + 1) {
    for (_v_2 = 0; _v_2 < options->width; _v_2 = _v_2 + 1) {
      auVar26 = vcvtusi2ss_avx512f(auVar27._0_16_,_v_2);
      auVar2 = vcvtusi2ss_avx512f(auVar28._0_16_,options->width);
      fVar24 = (auVar26._0_4_ + auVar26._0_4_) / auVar2._0_4_ - 1.0;
      auVar26 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar24),x);
      auVar2 = vcvtusi2ss_avx512f(auVar29._0_16_,options->height);
      auVar29 = ZEXT1664(auVar2);
      fVar1 = (auVar26._0_4_ + auVar26._0_4_) / auVar2._0_4_ - 1.0;
      __i = x * options->width + _v_2;
      TraversalStats::TraversalStats((TraversalStats *)&ray.tmin);
      local_760 = (Vec<float,_3UL> *)local_8b8;
      local_670.b = &local_65c;
      local_5a8.f = &local_670;
      local_5a8.v = (Vec<float,_3UL> *)local_58c;
      v_3.values._4_8_ = &local_5a8;
      local_754 = fVar24;
      local_670.a = local_760;
      local_65c = fVar24;
      local_658 = local_760;
      local_598 = local_5a8.f;
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,0);
      uVar16 = v_3.values._4_8_;
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,1);
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar16,2);
      v_5.values[1] = (float)local_58c._0_4_;
      v_5.values[2] = (float)local_58c._4_4_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_58c;
      local_650 = vmovlpd_avx(auVar11);
      local_648 = v_3.values[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_650;
      local_780 = vmovlpd_avx(auVar10);
      local_768 = v_3.values[0];
      local_748 = v_3.values[0];
      local_778 = v_3.values[0];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_780;
      local_9b0 = (float  [2])vmovlpd_avx(auVar9);
      local_9a8 = v_3.values[0];
      local_9a0.values[2] = v_3.values[0];
      local_7f0.a = (Vec<float,_3UL> *)local_898;
      local_7f0.b = &local_9a0;
      local_730.f = &local_7f0;
      local_730.v = (Vec<float,_3UL> *)local_714;
      local_9a0.values._0_8_ = local_9b0;
      local_7e0 = local_7f0.b;
      local_7d8 = local_7f0.a;
      local_770 = local_780;
      local_750 = local_780;
      local_720 = local_730.f;
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
      ::anon_class_16_2_94732099::operator()(&local_730,0);
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
      ::anon_class_16_2_94732099::operator()(&local_730,1);
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
      ::anon_class_16_2_94732099::operator()(&local_730,2);
      local_738 = v_4.values[0];
      local_740 = (ulong)local_714;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_714;
      local_810 = vmovlpd_avx(auVar8);
      local_7f8 = v_4.values[0];
      local_7c8 = v_4.values[0];
      local_808 = v_4.values[0];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_810;
      local_9c0 = (float  [2])vmovlpd_avx(auVar7);
      local_9b8 = v_4.values[0];
      local_990.values[2] = v_4.values[0];
      local_7a0 = (Vec<float,_3UL> *)&local_8f4;
      local_620.b = &local_60c;
      local_5e0.f = &local_620;
      local_5e0.v = (Vec<float,_3UL> *)local_5c4;
      local_990.values._0_8_ = local_9c0;
      local_800 = local_810;
      local_7d0 = local_810;
      local_794 = fVar1;
      local_620.a = local_7a0;
      local_60c = fVar1;
      local_608 = local_7a0;
      local_5d0 = local_5e0.f;
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
      ::anon_class_16_2_94732099::operator()(&local_5e0,0);
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
      ::anon_class_16_2_94732099::operator()(&local_5e0,1);
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
      ::anon_class_16_2_94732099::operator()(&local_5e0,2);
      local_5e8 = v_5.values[0];
      local_5f0 = (ulong)local_5c4;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_5c4;
      local_640 = vmovlpd_avx(auVar6);
      local_628 = v_5.values[0];
      local_5f8 = v_5.values[0];
      local_638 = v_5.values[0];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_640;
      local_7c0 = vmovlpd_avx(auVar5);
      local_7a8 = v_5.values[0];
      local_788 = v_5.values[0];
      local_7b8 = v_5.values[0];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_7c0;
      local_9e0 = (float  [2])vmovlpd_avx(auVar3);
      local_9d8 = v_5.values[0];
      local_9d0.values[2] = v_5.values[0];
      local_840.a = &local_990;
      local_840.b = &local_9d0;
      local_6f8.f = &local_840;
      local_6f8.v = (Vec<float,_3UL> *)local_6dc;
      v_6.values._4_8_ = &local_6f8;
      local_9d0.values._0_8_ = local_9e0;
      local_830 = local_840.b;
      local_828 = local_840.a;
      local_7b0 = local_7c0;
      local_790 = local_7c0;
      local_6e8 = local_6f8.f;
      local_630 = local_640;
      local_600 = local_640;
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_6.values._4_8_,0);
      uVar16 = v_6.values._4_8_;
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_6.values._4_8_,1);
      bvh::v2::Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar16,2);
      v_4.values[1] = (float)local_6dc._0_4_;
      v_4.values[2] = (float)local_6dc._4_4_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_6dc;
      local_820 = vmovlpd_avx(auVar2);
      local_818 = v_6.values[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_820;
      prim_id = vmovlpd_avx(auVar26);
      local_9e8 = v_6.values[0];
      local_97c = v_6.values[0];
      local_984 = prim_id;
      ray.dir.values[2] = std::numeric_limits<float>::max();
      auVar28 = ZEXT1664((undefined1  [16])0x0);
      local_978 = *(undefined1 (*) [8])(options->eye).values;
      ray.org.values[0] = (options->eye).values[2];
      ray.org.values[1] = (float)(undefined4)local_984;
      ray.org.values[2] = (float)local_984._4_4_;
      ray.dir.values[0] = local_97c;
      ray.dir.values[1] = 0.0;
      sStack_9f8 = (*stack0xfffffffffffff778)((Ray *)local_978,accel,(TraversalStats *)&ray.tmin);
      if (sStack_9f8 != 0xffffffffffffffff) {
        render_stats->intersections = render_stats->intersections + 1;
      }
      auVar27 = ZEXT1664((undefined1  [16])0x0);
      local_9fc = 0.0;
      if (options->render_mode == EyeLight) {
        if (sStack_9f8 != 0xffffffffffffffff) {
          pvVar17 = std::
                    vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
                    ::operator[](&accel->tris,sStack_9f8);
          __first1_00 = &pvVar17->n;
          local_300 = __first1_00;
          fVar24 = std::transform_reduce<float_const*,float_const*,float>
                             (__first1_00->values,(float *)(pvVar17 + 1),__first1_00->values,0.0);
          dVar25 = std::sqrt((double)(ulong)(uint)fVar24);
          local_2b4 = 1.0 / SUB84(dVar25,0);
          local_2c8.b = &local_2b4;
          local_288.f = &local_2c8;
          local_288.v = (Vec<float,_3UL> *)local_26c;
          v_7.values._4_8_ = &local_288;
          local_2c8.a = __first1_00;
          local_2b0 = __first1_00;
          local_278 = local_288.f;
          bvh::v2::Vec<float,_3UL>::
          generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
          ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_7.values._4_8_,0);
          uVar16 = v_7.values._4_8_;
          bvh::v2::Vec<float,_3UL>::
          generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
          ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_7.values._4_8_,1);
          bvh::v2::Vec<float,_3UL>::
          generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
          ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar16,2);
          local_290 = v_7.values[0];
          local_298 = (ulong)local_26c;
          local_2d0 = v_7.values[0];
          local_2d8 = (ulong)local_26c;
          local_2a0 = v_7.values[0];
          local_2a8 = (ulong)local_26c;
          local_2e0 = v_7.values[0];
          local_2e8 = (ulong)local_26c;
          local_308 = v_7.values[0];
          local_310 = (ulong)local_26c;
          local_2f0 = v_7.values[0];
          local_2f8 = (ulong)local_26c;
          local_318 = v_7.values[0];
          local_320 = (ulong)local_26c;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_26c;
          uStack_a18 = vmovlpd_avx(auVar4);
          local_a10 = v_7.values[0];
          local_a00 = v_7.values[0];
          __first1_01 = (float *)&local_a08;
          local_a08 = uStack_a18;
          fVar24 = std::transform_reduce<float_const*,float_const*,float>
                             (__first1_01,&local_9fc,ray.org.values + 1,0.0);
          std::abs((int)__first1_01);
          local_9fc = fVar24;
        }
        local_a20 = 0;
        auVar28 = ZEXT464(0x43800000);
        auVar27 = ZEXT464((uint)(local_9fc * 256.0));
        debug_threshold = (Scalar)(int)(local_9fc * 256.0);
        piVar18 = std::max<int>(&local_a20,(int *)&debug_threshold);
        local_a28 = 0xff;
        piVar18 = std::min<int>(piVar18,&local_a28);
        iVar12 = *piVar18;
        local_a19 = (uchar)iVar12;
        puVar19 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                  operator[](&__return_storage_ptr__->data,__i * 3);
        uVar13 = local_a19;
        *puVar19 = (uchar)iVar12;
        puVar19 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                  operator[](&__return_storage_ptr__->data,__i * 3 + 1);
        uVar14 = local_a19;
        *puVar19 = uVar13;
        puVar19 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                  operator[](&__return_storage_ptr__->data,__i * 3 + 2);
        *puVar19 = uVar14;
      }
      else {
        uVar20 = ray._24_8_ + traversal_stats.visited_nodes;
        puVar21 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::
                  operator[](&local_910,__i);
        *puVar21 = uVar20;
        TraversalStats::operator+=(&render_stats->traversal_stats,(TraversalStats *)&ray.tmin);
      }
    }
  }
  if (options->render_mode == Debug) {
    auVar26 = vcvtusi2ss_avx512f(auVar27._0_16_,options->debug_threshold);
    i._4_4_ = auVar26._0_4_;
    auVar27 = ZEXT464((uint)i._4_4_);
    auVar26 = ZEXT416((uint)i._4_4_);
    if ((i._4_4_ == 0.0) && (!NAN(i._4_4_))) {
      __first = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                          (&local_910);
      puVar22 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                          (&local_910);
      puVar23 = std::max_element<unsigned_long*>(__first,puVar22 + options->width * options->height)
      ;
      auVar26 = vcvtusi2ss_avx512f(auVar26,*puVar23);
      auVar27 = ZEXT1664(auVar26);
      i._4_4_ = auVar26._0_4_;
    }
    for (local_a38 = 0; auVar26 = auVar27._0_16_, local_a38 < options->width * options->height;
        local_a38 = local_a38 + 1) {
      puVar21 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                          (&local_910,local_a38);
      auVar26 = vcvtusi2ss_avx512f(auVar26,*puVar21);
      fVar24 = auVar26._0_4_ / i._4_4_;
      auVar27 = ZEXT1664(CONCAT124(auVar26._4_12_,fVar24));
      intensity_to_color(fVar24);
      puVar19 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                          (&__return_storage_ptr__->data,local_a38 * 3);
      __args_1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&__return_storage_ptr__->data,local_a38 * 3 + 1);
      __args_2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&__return_storage_ptr__->data,local_a38 * 3 + 2);
      std::tie<unsigned_char,unsigned_char,unsigned_char>(&local_a58,puVar19,__args_1,__args_2);
      std::tuple<unsigned_char&,unsigned_char&,unsigned_char&>::operator=
                ((tuple<unsigned_char&,unsigned_char&,unsigned_char&> *)&local_a58,&local_a3b);
    }
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr(&local_910);
  return __return_storage_ptr__;
}

Assistant:

static Image render(const Accel& accel, RenderStats& render_stats, const Options& options) {
    auto intersect_accel = get_intersect_accel_fn(options);

    auto dir = normalize(options.dir);
    auto right = normalize(cross(dir, options.up));
    auto up = cross(right, dir);

    auto debug_data = options.render_mode == RenderMode::Debug
        ? std::make_unique<size_t[]>(options.width * options.height) : nullptr;

    Image image(options.width, options.height);
    for (size_t y = 0; y < options.height; ++y) {
        for (size_t x = 0; x < options.width; ++x) {
            auto u = Scalar{2} * static_cast<Scalar>(x) / static_cast<Scalar>(options.width) - Scalar{1};
            auto v = Scalar{2} * static_cast<Scalar>(y) / static_cast<Scalar>(options.height) - Scalar{1};
            auto pixel_id = y * options.width + x;

            TraversalStats traversal_stats;
            Ray ray(options.eye, dir + u * right + v * up);
            auto prim_id = intersect_accel(ray, accel, traversal_stats);
            if (prim_id != invalid_id)
                render_stats.intersections++;
            Scalar intensity = 0;
            if (options.render_mode == RenderMode::EyeLight) {
                if (prim_id != invalid_id)
                    intensity = std::abs(dot(normalize(accel.tris[prim_id].n), ray.dir));
                uint8_t pixel = static_cast<uint8_t>(
                    std::min(std::max(0, static_cast<int>(intensity * Scalar{256})), 255));
                image.data[3 * pixel_id + 0] = pixel;
                image.data[3 * pixel_id + 1] = pixel;
                image.data[3 * pixel_id + 2] = pixel;
            } else {
                debug_data[pixel_id] =
                    traversal_stats.visited_nodes + traversal_stats.visited_leaves;
                render_stats.traversal_stats += traversal_stats;
            }
        }
    }

    if (options.render_mode == RenderMode::Debug) {
        Scalar debug_threshold = static_cast<Scalar>(options.debug_threshold);
        if (debug_threshold == static_cast<Scalar>(0))
            debug_threshold = static_cast<Scalar>(
                *std::max_element(debug_data.get(), debug_data.get() + options.width * options.height));
        for (size_t i = 0; i < options.width * options.height; ++i) {
            std::tie(
                image.data[3 * i + 0],
                image.data[3 * i + 1],
                image.data[3 * i + 2]) = intensity_to_color(static_cast<Scalar>(debug_data[i]) / debug_threshold);
        }
    }

    return image;
}